

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

JitTypePropertyGuard * __thiscall
Lowerer::CreateTypePropertyGuardForGuardedProperties
          (Lowerer *this,JITTypeHolder type,PropertySymOpnd *propertySymOpnd)

{
  BVSparse<Memory::JitArenaAllocator> *pBVar1;
  Func *this_00;
  long lVar2;
  code *pcVar3;
  int iVar4;
  Lowerer *pLVar5;
  bool bVar6;
  uint id;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  FunctionJITTimeInfo *pFVar10;
  ObjTypeSpecFldInfo *this_01;
  JITType *this_02;
  intptr_t typeAddr;
  JitTypePropertyGuard *pJVar11;
  JITTimeFunctionBody *pJVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  ulong uVar15;
  Type_conflict pBVar16;
  ulong uVar17;
  uint local_d8 [22];
  ulong local_80;
  Phases *local_78;
  Lowerer *local_70;
  JITTypeHolderBase<void> local_68;
  JitTypePropertyGuard **local_60;
  JitTypePropertyGuard *local_58;
  JitTypePropertyGuard *guard;
  undefined4 *local_48;
  Type_conflict local_40;
  uint local_34;
  
  if (propertySymOpnd->guardedPropOps == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1ee7,"(propertySymOpnd->GetGuardedPropOps() != nullptr)",
                       "propertySymOpnd->GetGuardedPropOps() != nullptr");
    if (!bVar6) goto LAB_005d591c;
    *puVar9 = 0;
  }
  local_58 = (JitTypePropertyGuard *)0x0;
  pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  bVar6 = FunctionJITTimeInfo::HasSharedPropertyGuards(pFVar10);
  if (bVar6) {
    pBVar1 = propertySymOpnd->guardedPropOps;
    local_60 = &local_58;
    local_70 = this;
    local_68.t = type.t;
    pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    bVar6 = FunctionJITTimeInfo::HasSharedPropertyGuards(pFVar10);
    if (!bVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1fd8,
                         "(this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())"
                         ,"this->m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards()"
                        );
      if (!bVar6) goto LAB_005d591c;
      *puVar9 = 0;
    }
    if (pBVar1 == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1fd9,"(guardedPropOps != nullptr)","guardedPropOps != nullptr");
      if (!bVar6) {
LAB_005d591c:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar9 = 0;
    }
    pBVar16 = pBVar1->head;
    if (pBVar16 != (Type_conflict)0x0) {
      local_48 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      local_78 = (Phases *)&DAT_015c1bd0;
      guard = (JitTypePropertyGuard *)&DAT_015cd718;
      do {
        uVar17 = (pBVar16->data).word;
        local_40 = pBVar16;
        if (uVar17 != 0) {
          local_80 = (ulong)pBVar16->startIndex;
          uVar15 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
            }
          }
          do {
            iVar4 = (int)local_80;
            BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar15);
            this_01 = Func::GetGlobalObjTypeSpecFldInfo(this->m_func,iVar4 + (BVIndex)uVar15);
            id = ObjTypeSpecFldInfo::GetPropertyId(this_01);
            bVar6 = ObjTypeSpecFldInfo::IsBeingAdded(this_01);
            if (((bVar6) || (bVar6 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_01), bVar6)) ||
               (bVar6 = ObjTypeSpecFldInfo::HasFixedValue(this_01), bVar6)) {
              bVar6 = ObjTypeSpecFldInfo::IsPoly(this_01);
              if (((bVar6) && (bVar6 = ObjTypeSpecFldInfo::HasFixedValue(this_01), bVar6)) &&
                 ((bVar6 = ObjTypeSpecFldInfo::IsLoadedFromProto(this_01), !bVar6 &&
                  (bVar6 = ObjTypeSpecFldInfo::UsesAccessor(this_01), !bVar6)))) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar9 = local_48;
                *local_48 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                   ,0x1fee,
                                   "(!propertyOpInfo->IsPoly() || (!propertyOpInfo->HasFixedValue() || propertyOpInfo->IsLoadedFromProto() || propertyOpInfo->UsesAccessor()))"
                                   ,
                                   "!propertyOpInfo->IsPoly() || (!propertyOpInfo->HasFixedValue() || propertyOpInfo->IsLoadedFromProto() || propertyOpInfo->UsesAccessor())"
                                  );
                if (!bVar6) goto LAB_005d591c;
                *puVar9 = 0;
              }
              pFVar10 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
              bVar6 = FunctionJITTimeInfo::HasSharedPropertyGuard(pFVar10,id);
              pLVar5 = local_70;
              if (bVar6) {
                local_34 = id;
                bVar6 = Func::ShouldDoLazyBailOut(local_70->m_func);
                if ((bVar6) &&
                   (bVar6 = Js::Phases::IsEnabled(local_78,LazyFixedTypeBailoutPhase), bVar6)) {
                  local_d8[0] = local_34;
                  JsUtil::
                  BaseDictionary<int,int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                  ::
                  Insert<(JsUtil::BaseDictionary<int,int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                            ((BaseDictionary<int,int,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
                              *)&pLVar5->m_func->lazyBailoutProperties,(int *)local_d8,
                             (int *)&local_34);
                }
                else {
                  if (*local_60 == (JitTypePropertyGuard *)0x0) {
                    this_00 = pLVar5->m_func;
                    this_02 = JITTypeHolderBase<void>::operator->(&local_68);
                    typeAddr = JITType::GetAddr(this_02);
                    pJVar11 = Func::GetOrCreateSingleTypeGuard(this_00,typeAddr);
                    *local_60 = pJVar11;
                  }
                  pJVar12 = JITTimeWorkItem::GetJITFunctionBody(pLVar5->m_func->m_workItem);
                  uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
                  pFVar10 = JITTimeWorkItem::GetJITTimeInfo(pLVar5->m_func->m_workItem);
                  uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
                  bVar6 = Js::Phases::IsEnabled((Phases *)guard,ObjTypeSpecPhase,uVar7,uVar8);
                  if (bVar6) {
LAB_005d585e:
                    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(pLVar5->m_func->m_workItem);
                    pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar12);
                    pFVar10 = JITTimeWorkItem::GetJITTimeInfo(pLVar5->m_func->m_workItem);
                    pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet
                                        (pFVar10,(wchar (*) [42])local_d8);
                    Output::Print(L"ObjTypeSpec: function %s(%s) registered guard 0x%p with value 0x%p for property ID %u.\n"
                                  ,pcVar13,pcVar14,*local_60,
                                  ((*local_60)->super_JitIndexedPropertyGuard).super_PropertyGuard.
                                  value,(ulong)local_34);
                    Output::Flush();
                  }
                  else {
                    pJVar12 = JITTimeWorkItem::GetJITFunctionBody(pLVar5->m_func->m_workItem);
                    uVar7 = JITTimeFunctionBody::GetSourceContextId(pJVar12);
                    pFVar10 = JITTimeWorkItem::GetJITTimeInfo(pLVar5->m_func->m_workItem);
                    uVar8 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar10);
                    bVar6 = Js::Phases::IsEnabled
                                      ((Phases *)guard,TracePropertyGuardsPhase,uVar7,uVar8);
                    if (bVar6) goto LAB_005d585e;
                  }
                  Func::EnsurePropertyGuardsByPropertyId(pLVar5->m_func);
                  Func::LinkGuardToPropertyId
                            (pLVar5->m_func,local_34,&(*local_60)->super_JitIndexedPropertyGuard);
                }
              }
              else {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar9 = local_48;
                *local_48 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                   ,0x1ff7,"(false)",
                                   "Did we fail to create a shared property guard for a guarded property?"
                                  );
                if (!bVar6) goto LAB_005d591c;
                *puVar9 = 0;
              }
            }
            uVar17 = uVar17 & ~(1L << (uVar15 & 0x3f));
            lVar2 = 0;
            if (uVar17 != 0) {
              for (; (uVar17 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
              }
            }
            uVar15 = (ulong)(-(uint)(uVar17 == 0) | (uint)lVar2);
          } while (uVar17 != 0);
        }
        pBVar16 = local_40->next;
      } while (pBVar16 != (Type)0x0);
    }
  }
  return local_58;
}

Assistant:

Js::JitTypePropertyGuard*
Lowerer::CreateTypePropertyGuardForGuardedProperties(JITTypeHolder type, IR::PropertySymOpnd* propertySymOpnd)
{
    // We should always have a list of guarded properties.
    Assert(propertySymOpnd->GetGuardedPropOps() != nullptr);

    Js::JitTypePropertyGuard* guard = nullptr;

    if (m_func->GetWorkItem()->GetJITTimeInfo()->HasSharedPropertyGuards())
    {
        // Consider (ObjTypeSpec): Because we allocate these guards from the JIT thread we can't share guards for the same type across multiple functions.
        // This leads to proliferation of property guards on the thread context.  The alternative would be to pre-allocate shared (by value) guards
        // from the thread context during work item creation.  We would create too many of them (because some types aren't actually used as guards),
        // but we could share a guard for a given type between functions.  This may ultimately be better.

        LinkGuardToGuardedProperties(propertySymOpnd->GetGuardedPropOps(), [this, type, &guard](Js::PropertyId propertyId)
        {
            if (ShouldDoLazyFixedTypeBailout(this->m_func))
            {
                this->m_func->lazyBailoutProperties.Item(propertyId);
            }
            else
            {
                if (guard == nullptr)
                {
                    guard = this->m_func->GetOrCreateSingleTypeGuard(type->GetAddr());
                }

                if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->m_func) || PHASE_TRACE(Js::TracePropertyGuardsPhase, this->m_func))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    Output::Print(_u("ObjTypeSpec: function %s(%s) registered guard 0x%p with value 0x%p for property ID %u.\n"),
                        m_func->GetJITFunctionBody()->GetDisplayName(), this->m_func->GetDebugNumberSet(debugStringBuffer),
                        guard, guard->GetValue(), propertyId);
                    Output::Flush();
                }

                this->m_func->EnsurePropertyGuardsByPropertyId();
                this->m_func->LinkGuardToPropertyId(propertyId, guard);
            }
        });
    }

    return guard;
}